

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenInitializer::ConfigFileNamesAndGenex
          (cmQtAutoGenInitializer *this,ConfigString *configString,string *genex,string_view prefix,
          string_view suffix)

{
  string_view local_80;
  string local_70;
  size_t local_50;
  char *local_48;
  cmQtAutoGenInitializer *local_40;
  char *local_38;
  string *local_30;
  string *genex_local;
  ConfigString *configString_local;
  cmQtAutoGenInitializer *this_local;
  string_view prefix_local;
  
  local_38 = prefix._M_str;
  local_40 = (cmQtAutoGenInitializer *)prefix._M_len;
  local_50 = suffix._M_len;
  local_48 = suffix._M_str;
  local_30 = genex;
  genex_local = &configString->Default;
  configString_local = (ConfigString *)this;
  this_local = local_40;
  prefix_local._M_len = (size_t)local_38;
  ConfigFileNames(this,configString,prefix,suffix);
  if ((this->MultiConfig & 1U) == 0) {
    std::__cxx11::string::operator=((string *)local_30,(string *)genex_local);
  }
  else {
    local_80 = (string_view)::cm::operator____s("_$<CONFIG>",10);
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>const&>
              (&local_70,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               (static_string_view *)&local_80,&suffix);
    std::__cxx11::string::operator=((string *)local_30,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::ConfigFileNamesAndGenex(
  ConfigString& configString, std::string& genex, cm::string_view const prefix,
  cm::string_view const suffix)
{
  this->ConfigFileNames(configString, prefix, suffix);
  if (this->MultiConfig) {
    genex = cmStrCat(prefix, "_$<CONFIG>"_s, suffix);
  } else {
    genex = configString.Default;
  }
}